

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderProgram
          (GLShaderProgram *this,
          vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
          *stages,DrawMode dm,uint nPatchVertices)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar2;
  invalid_argument *this_00;
  uint in_ECX;
  DrawMode in_EDX;
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  *in_RSI;
  ShaderProgram *in_RDI;
  ShaderSpecTexture t;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  *__range3_2;
  ShaderSpecAttribute a;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  *__range3_1;
  ShaderSpecUniform u;
  const_iterator __end3;
  const_iterator __begin3;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  *__range3;
  ShaderStageSpecification *s;
  const_iterator __end2;
  const_iterator __begin2;
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  *__range2;
  GLint maxPatchVertices;
  ShaderSpecAttribute *in_stack_fffffffffffffd98;
  ShaderSpecAttribute *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffdec;
  ShaderSpecAttribute *in_stack_fffffffffffffe18;
  const_iterator in_stack_fffffffffffffe20;
  __normal_iterator<const_polyscope::render::ShaderSpecTexture_*,_std::vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>_>
  local_1d8;
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  *local_1d0;
  ShaderSpecTexture *in_stack_fffffffffffffe38;
  GLShaderProgram *in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe57;
  GLShaderProgram *in_stack_fffffffffffffe60;
  const_iterator in_stack_fffffffffffffe88;
  const_iterator in_stack_fffffffffffffe90;
  GLShaderProgram *in_stack_fffffffffffffec0;
  __normal_iterator<const_polyscope::render::ShaderSpecUniform_*,_std::vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>_>
  local_108;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  *local_100;
  reference local_f8;
  ShaderStageSpecification *local_f0;
  __normal_iterator<const_polyscope::render::ShaderStageSpecification_*,_std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>_>
  local_e8;
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  *local_e0;
  undefined1 local_d1;
  string local_50 [52];
  uint local_1c;
  uint local_18;
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  *local_10;
  
  local_18 = in_ECX;
  local_10 = in_RSI;
  ShaderProgram::ShaderProgram(in_RDI,in_RSI,in_EDX,in_ECX);
  in_RDI->_vptr_ShaderProgram = (_func_int **)&PTR__GLShaderProgram_00796100;
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
  ::vector((vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
            *)0x3de0ae);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  ::vector((vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
            *)0x3de0c1);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
  ::vector((vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
            *)0x3de0d4);
  *(undefined4 *)&in_RDI[2].indexSize = 0;
  (*glad_glGetIntegerv)(0x8e7d,(GLint *)&local_1c);
  if ((local_18 != 0) && (local_1c < local_18)) {
    local_d1 = 1;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::__cxx11::to_string((uint)((ulong)in_RDI >> 0x20));
    std::operator+((char *)__lhs,&in_stack_fffffffffffffda0->name);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffda0);
    std::__cxx11::to_string(in_stack_fffffffffffffdec);
    std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_50);
    local_d1 = 0;
    __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_e0 = local_10;
  local_e8._M_current =
       (ShaderStageSpecification *)
       std::
       vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
       ::begin((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                *)in_stack_fffffffffffffd98);
  local_f0 = (ShaderStageSpecification *)
             std::
             vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             ::end((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                    *)in_stack_fffffffffffffd98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_polyscope::render::ShaderStageSpecification_*,_std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>_>
                        *)in_stack_fffffffffffffda0,
                       (__normal_iterator<const_polyscope::render::ShaderStageSpecification_*,_std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>_>
                        *)in_stack_fffffffffffffd98);
    if (!bVar1) break;
    local_f8 = __gnu_cxx::
               __normal_iterator<const_polyscope::render::ShaderStageSpecification_*,_std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>_>
               ::operator*(&local_e8);
    local_100 = &local_f8->uniforms;
    local_108._M_current =
         (ShaderSpecUniform *)
         std::
         vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
         ::begin((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                  *)in_stack_fffffffffffffd98);
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::end((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
           *)in_stack_fffffffffffffd98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_polyscope::render::ShaderSpecUniform_*,_std::vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>_>
                          *)in_stack_fffffffffffffda0,
                         (__normal_iterator<const_polyscope::render::ShaderSpecUniform_*,_std::vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>_>
                          *)in_stack_fffffffffffffd98);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_polyscope::render::ShaderSpecUniform_*,_std::vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>_>
      ::operator*(&local_108);
      ShaderSpecUniform::ShaderSpecUniform
                ((ShaderSpecUniform *)in_stack_fffffffffffffda0,
                 (ShaderSpecUniform *)in_stack_fffffffffffffd98);
      ShaderSpecUniform::ShaderSpecUniform
                ((ShaderSpecUniform *)in_stack_fffffffffffffda0,
                 (ShaderSpecUniform *)in_stack_fffffffffffffd98);
      addUniqueUniform((GLShaderProgram *)in_stack_fffffffffffffe20._M_current,
                       (ShaderSpecUniform *)in_stack_fffffffffffffe18);
      ShaderSpecUniform::~ShaderSpecUniform((ShaderSpecUniform *)0x3de411);
      ShaderSpecUniform::~ShaderSpecUniform((ShaderSpecUniform *)0x3de41e);
      __gnu_cxx::
      __normal_iterator<const_polyscope::render::ShaderSpecUniform_*,_std::vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>_>
      ::operator++(&local_108);
    }
    in_stack_fffffffffffffe90 =
         std::
         vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
         ::begin(in_stack_fffffffffffffd98);
    in_stack_fffffffffffffe88 =
         std::
         vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
         ::end(in_stack_fffffffffffffd98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_polyscope::render::ShaderSpecAttribute_*,_std::vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>_>
                          *)in_stack_fffffffffffffda0,
                         (__normal_iterator<const_polyscope::render::ShaderSpecAttribute_*,_std::vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>_>
                          *)in_stack_fffffffffffffd98);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_polyscope::render::ShaderSpecAttribute_*,_std::vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>_>
      ::operator*((__normal_iterator<const_polyscope::render::ShaderSpecAttribute_*,_std::vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>_>
                   *)&stack0xfffffffffffffe90);
      ShaderSpecAttribute::ShaderSpecAttribute(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      ShaderSpecAttribute::ShaderSpecAttribute(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      addUniqueAttribute((GLShaderProgram *)in_stack_fffffffffffffe20._M_current,
                         in_stack_fffffffffffffe18);
      ShaderSpecAttribute::~ShaderSpecAttribute((ShaderSpecAttribute *)0x3de52c);
      ShaderSpecAttribute::~ShaderSpecAttribute((ShaderSpecAttribute *)0x3de539);
      __gnu_cxx::
      __normal_iterator<const_polyscope::render::ShaderSpecAttribute_*,_std::vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>_>
      ::operator++((__normal_iterator<const_polyscope::render::ShaderSpecAttribute_*,_std::vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>_>
                    *)&stack0xfffffffffffffe90);
    }
    local_1d0 = &local_f8->textures;
    local_1d8._M_current =
         (ShaderSpecTexture *)
         std::
         vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
         ::begin((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                  *)in_stack_fffffffffffffd98);
    in_stack_fffffffffffffe20 =
         std::
         vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
         ::end((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                *)in_stack_fffffffffffffd98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_polyscope::render::ShaderSpecTexture_*,_std::vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>_>
                          *)in_stack_fffffffffffffda0,
                         (__normal_iterator<const_polyscope::render::ShaderSpecTexture_*,_std::vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>_>
                          *)in_stack_fffffffffffffd98);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_polyscope::render::ShaderSpecTexture_*,_std::vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>_>
      ::operator*(&local_1d8);
      ShaderSpecTexture::ShaderSpecTexture
                ((ShaderSpecTexture *)in_stack_fffffffffffffda0,
                 (ShaderSpecTexture *)in_stack_fffffffffffffd98);
      ShaderSpecTexture::ShaderSpecTexture
                ((ShaderSpecTexture *)in_stack_fffffffffffffda0,
                 (ShaderSpecTexture *)in_stack_fffffffffffffd98);
      addUniqueTexture(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      ShaderSpecTexture::~ShaderSpecTexture((ShaderSpecTexture *)0x3de638);
      ShaderSpecTexture::~ShaderSpecTexture((ShaderSpecTexture *)0x3de642);
      __gnu_cxx::
      __normal_iterator<const_polyscope::render::ShaderSpecTexture_*,_std::vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>_>
      ::operator++(&local_1d8);
    }
    __gnu_cxx::
    __normal_iterator<const_polyscope::render::ShaderStageSpecification_*,_std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>_>
    ::operator++(&local_e8);
  }
  sVar2 = std::
          vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
          ::size((vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
                  *)&in_RDI[1].indexSize);
  if (sVar2 == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Uh oh... GLProgram has no attributes");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  compileGLProgram((GLShaderProgram *)in_stack_fffffffffffffe90._M_current,
                   (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                    *)in_stack_fffffffffffffe88._M_current);
  setDataLocations(in_stack_fffffffffffffec0);
  createBuffers(in_stack_fffffffffffffe60);
  checkGLError((bool)in_stack_fffffffffffffe57);
  return;
}

Assistant:

GLShaderProgram::GLShaderProgram(const std::vector<ShaderStageSpecification>& stages, DrawMode dm,
                                 unsigned int nPatchVertices)
    : ShaderProgram(stages, dm, nPatchVertices) {

  GLint maxPatchVertices;
  glGetIntegerv(GL_MAX_PATCH_VERTICES, &maxPatchVertices);
  if (nPatchVertices != 0 && nPatchVertices > (unsigned int)maxPatchVertices) {
    throw std::invalid_argument("Requested number of patch vertices (" + std::to_string(nPatchVertices) +
                                ") is greater than the number supported by the tessellator (" +
                                std::to_string(maxPatchVertices));
  }


  // Collect attributes and uniforms from all of the shaders
  for (const ShaderStageSpecification& s : stages) {
    for (ShaderSpecUniform u : s.uniforms) {
      addUniqueUniform(u);
    }
    for (ShaderSpecAttribute a : s.attributes) {
      addUniqueAttribute(a);
    }
    for (ShaderSpecTexture t : s.textures) {
      addUniqueTexture(t);
    }
  }

  if (attributes.size() == 0) {
    throw std::invalid_argument("Uh oh... GLProgram has no attributes");
  }


  // Perform setup tasks
  compileGLProgram(stages);
  setDataLocations();
  createBuffers();
  checkGLError();
}